

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.h
# Opt level: O2

CostType __thiscall wasm::CostAnalyzer::visitBlock(CostAnalyzer *this,Block *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  uint uVar2;
  Expression **ppEVar3;
  CostType CVar4;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
           usedElements;
  CVar4 = 0;
  local_40 = (undefined1  [8])&curr->list;
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])&curr->list))) {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_40);
    uVar2 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)this,*ppEVar3);
    CVar4 = CVar4 + uVar2;
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  return CVar4;
}

Assistant:

CostType visitBlock(Block* curr) {
    CostType ret = 0;
    for (auto* child : curr->list) {
      ret += visit(child);
    }
    return ret;
  }